

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

void calc_sad4_update_bestmv
               (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,MV_COST_PARAMS *mv_cost_params,
               FULLPEL_MV *best_mv,FULLPEL_MV center_mv,uint8_t *center_address,uint *bestsad,
               uint *raw_bestsad,int search_step,int *best_site,int cand_start,int *cost_list)

{
  int iVar1;
  uint uVar2;
  buf_2d *pbVar3;
  search_site_config *psVar4;
  uint8_t *puVar5;
  ushort uVar6;
  FULLPEL_MV FVar7;
  long lVar8;
  short sVar9;
  short sVar10;
  ushort uVar11;
  long lVar12;
  uint *puVar13;
  short sVar14;
  ushort uVar15;
  uint uVar16;
  uchar *block_offset [4];
  short local_74;
  uint local_68 [4];
  uint8_t *local_58 [5];
  
  lVar8 = (long)search_step;
  pbVar3 = (ms_params->ms_buffers).src;
  psVar4 = ms_params->search_sites;
  puVar5 = pbVar3->buf;
  iVar1 = pbVar3->stride;
  pbVar3 = (ms_params->ms_buffers).ref;
  lVar12 = 0;
  do {
    local_58[lVar12] = center_address + psVar4->site[lVar8][cand_start + lVar12].offset;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  puVar13 = (uint *)(cost_list + 1);
  if (cost_list == (int *)0x0) {
    puVar13 = local_68;
  }
  (*ms_params->sdx4df)(puVar5,iVar1,local_58,pbVar3->stride,puVar13);
  lVar12 = 0;
  do {
    uVar2 = puVar13[lVar12];
    if (uVar2 < *bestsad) {
      sVar9 = psVar4->site[lVar8][cand_start + lVar12].mv.row + center_mv.row;
      local_74 = center_mv.col;
      local_74 = psVar4->site[lVar8][cand_start + lVar12].mv.col + local_74;
      if (mv_cost_params->mv_cost_type < 4) {
        sVar14 = sVar9 - (mv_cost_params->full_ref_mv).row;
        sVar10 = local_74 - (mv_cost_params->full_ref_mv).col;
        uVar15 = sVar14 * 8;
        uVar11 = sVar10 * 8;
        switch(mv_cost_params->mv_cost_type) {
        case '\0':
          uVar16 = (mv_cost_params->mvcost[0][(short)uVar15] +
                    *(int *)((long)mv_cost_params->mvjcost +
                            (ulong)((uint)(uVar11 != 0) * 4 + (uint)(uVar15 != 0) * 8)) +
                   mv_cost_params->mvcost[1][(short)uVar11]) * mv_cost_params->sad_per_bit + 0x100U
                   >> 9;
          break;
        case '\x01':
          uVar6 = sVar14 * -8;
          if ((short)(sVar14 * -8) < 0) {
            uVar6 = uVar15;
          }
          uVar15 = sVar10 * -8;
          if ((short)(sVar10 * -8) < 0) {
            uVar15 = uVar11;
          }
          uVar16 = ((uint)uVar15 + (uint)uVar6) * 4;
          break;
        case '\x02':
          uVar6 = sVar14 * -8;
          if ((short)(sVar14 * -8) < 0) {
            uVar6 = uVar15;
          }
          uVar15 = sVar10 * -8;
          if ((short)(sVar10 * -8) < 0) {
            uVar15 = uVar11;
          }
          uVar16 = ((uint)uVar15 + (uint)uVar6) * 0xf >> 3;
          break;
        case '\x03':
          uVar6 = sVar14 * -8;
          if ((short)(sVar14 * -8) < 0) {
            uVar6 = uVar15;
          }
          uVar15 = sVar10 * -8;
          if ((short)(sVar10 * -8) < 0) {
            uVar15 = uVar11;
          }
          uVar16 = (uint)uVar15 + (uint)uVar6;
        }
      }
      else {
        uVar16 = 0;
      }
      if (uVar16 + uVar2 < *bestsad) {
        if (raw_bestsad != (uint *)0x0) {
          *raw_bestsad = uVar2;
        }
        *bestsad = uVar16 + uVar2;
        FVar7.col = local_74;
        FVar7.row = sVar9;
        *best_mv = FVar7;
        *best_site = cand_start + (int)lVar12;
      }
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  return;
}

Assistant:

static inline void calc_sad4_update_bestmv(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
    const MV_COST_PARAMS *mv_cost_params, FULLPEL_MV *best_mv,
    const FULLPEL_MV center_mv, const uint8_t *center_address,
    unsigned int *bestsad, unsigned int *raw_bestsad, int search_step,
    int *best_site, int cand_start, int *cost_list) {
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const search_site *site = ms_params->search_sites->site[search_step];

  unsigned char const *block_offset[4];
  unsigned int sads_buf[4];
  unsigned int *sads;
  const uint8_t *src_buf = src->buf;
  const int src_stride = src->stride;
  if (cost_list) {
    sads = (unsigned int *)(cost_list + 1);
  } else {
    sads = sads_buf;
  }
  // Loop over number of candidates.
  for (int j = 0; j < 4; j++)
    block_offset[j] = site[cand_start + j].offset + center_address;

  // 4-point sad calculation.
  ms_params->sdx4df(src_buf, src_stride, block_offset, ref->stride, sads);

  for (int j = 0; j < 4; j++) {
    const FULLPEL_MV this_mv = { center_mv.row + site[cand_start + j].mv.row,
                                 center_mv.col + site[cand_start + j].mv.col };
    const int found_better_mv = update_mvs_and_sad(
        sads[j], &this_mv, mv_cost_params, bestsad, raw_bestsad, best_mv,
        /*second_best_mv=*/NULL);
    if (found_better_mv) *best_site = cand_start + j;
  }
}